

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
::Iterator<Kernel::TypedTermList,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
          (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
           *this,SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed,AbstractingUnifier args,
          AbstractionOracle args_1,bool args_2)

{
  AbstractingUnifier local_60;
  
  Kernel::AbstractingUnifier::AbstractingUnifier((AbstractingUnifier *)this);
  this[0x60] = (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
                )0x0;
  *(undefined8 *)(this + 0xc0) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0xb0) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  local_60._subs._self._M_t.
  super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>._M_t
  .super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>.
  super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl =
       *(__uniq_ptr_data<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>,_true,_true>
         *)args._subs._self._M_t.
           super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
           ._M_t.
           super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
           .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl;
  *(undefined8 *)
   args._subs._self._M_t.
   super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>.
   _M_t.
   super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>.
   super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl = 0;
  local_60._constr._self._M_t.
  super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  ._M_t.
  super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
  .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl =
       *(__uniq_ptr_data<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>,_true,_true>
         *)&((_Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
              *)((long)args._subs._self._M_t.
                       super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                       .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl + 0x10)
            )->super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>;
  *(undefined8 *)
   ((long)args._subs._self._M_t.
          super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
          ._M_t.
          super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
          .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl + 0x10) = 0;
  local_60._bd.super_OptionBase<Lib::BacktrackData_&>.super_OptionBaseRef<Lib::BacktrackData_*>.
  _elem = *(OptionBase<Lib::BacktrackData_&> *)
           ((long)args._subs._self._M_t.
                  super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                  .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl + 0x20);
  local_60._uwa._mode =
       *(UnificationWithAbstraction *)
        ((long)args._subs._self._M_t.
               super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
               ._M_t.
               super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
               .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl + 0x28);
  init<Kernel::TypedTermList,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
            (this,parent,root,query,retrieveSubstitution,reversed,&local_60,
             (AbstractionOracle)args._subs._8_4_,
             args._constr._self._M_t.
             super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
             .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl._0_1_)
  ;
  Kernel::AbstractingUnifier::~AbstractingUnifier(&local_60);
  return;
}

Assistant:

Iterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args)
       : _algo()
      { init(parent, root, query, retrieveSubstitution, reversed, std::move(args)...); }